

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

int Wlc_NtkCollectObjs_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vObjs)

{
  ushort uVar1;
  int iVar2;
  Wlc_Obj_t *pObj_00;
  int iVar3;
  int i;
  
  uVar1 = *(ushort *)pObj;
  iVar3 = 0;
  if (-1 < (char)uVar1 && (uVar1 & 0x3d) != 1) {
    *(ushort *)pObj = uVar1 | 0x80;
    iVar3 = 0;
    for (i = 0; i < (int)pObj->nFanins; i = i + 1) {
      iVar2 = Wlc_ObjFaninId(pObj,i);
      pObj_00 = Wlc_NtkObj(p,iVar2);
      iVar2 = Wlc_NtkCollectObjs_rec(p,pObj_00,vObjs);
      iVar3 = iVar3 + iVar2;
    }
    Vec_IntPush(vObjs,(int)(((long)pObj - (long)p->pObjs) / 0x18));
    iVar3 = iVar3 + (uint)((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
                          (undefined1  [24])0x2d);
  }
  return iVar3;
}

Assistant:

int Wlc_NtkCollectObjs_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vObjs )
{
    int i, iFanin, Count = 0;
    if ( Wlc_ObjIsCi(pObj) )
        return 0;
    if ( pObj->Mark )
        return 0;
    pObj->Mark = 1;
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Count += Wlc_NtkCollectObjs_rec( p, Wlc_NtkObj(p, iFanin), vObjs );
    Vec_IntPush( vObjs, Wlc_ObjId(p, pObj) );
    return Count + (int)(pObj->Type == WLC_OBJ_ARI_MULTI);
}